

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

void __thiscall icu_63::FixedDecimal::FixedDecimal(FixedDecimal *this,FixedDecimal *other)

{
  (this->super_IFixedDecimal)._vptr_IFixedDecimal = (_func_int **)&PTR__FixedDecimal_003b7c60;
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__FixedDecimal_003b7ca0;
  this->source = other->source;
  this->visibleDecimalDigitCount = other->visibleDecimalDigitCount;
  this->decimalDigits = other->decimalDigits;
  this->decimalDigitsWithoutTrailingZeros = other->decimalDigitsWithoutTrailingZeros;
  this->intValue = other->intValue;
  this->_hasIntegerValue = other->_hasIntegerValue;
  this->isNegative = other->isNegative;
  this->_isNaN = other->_isNaN;
  this->_isInfinite = other->_isInfinite;
  return;
}

Assistant:

FixedDecimal::FixedDecimal(const FixedDecimal &other) {
    source = other.source;
    visibleDecimalDigitCount = other.visibleDecimalDigitCount;
    decimalDigits = other.decimalDigits;
    decimalDigitsWithoutTrailingZeros = other.decimalDigitsWithoutTrailingZeros;
    intValue = other.intValue;
    _hasIntegerValue = other._hasIntegerValue;
    isNegative = other.isNegative;
    _isNaN = other._isNaN;
    _isInfinite = other._isInfinite;
}